

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.h
# Opt level: O3

void __thiscall
bloomfilter::BloomFilter<unsigned_long,_12UL,_false,_hashing::SimpleMixSplit,_8>::BloomFilter
          (BloomFilter<unsigned_long,_12UL,_false,_hashing::SimpleMixSplit,_8> *this,size_t n)

{
  uint64_t *__s;
  ulong uVar1;
  ulong uVar2;
  
  hashing::SimpleMixSplit::SimpleMixSplit(&this->hasher);
  this->size = 0;
  this->kk = 8;
  this->bitCount = n * 0xc;
  uVar2 = n * 0xc + 0x3f;
  uVar1 = uVar2 >> 6;
  this->arrayLength = uVar1;
  uVar1 = uVar1 << 3;
  __s = (uint64_t *)operator_new__(uVar1);
  this->data = __s;
  if (uVar2 < 0x40) {
    return;
  }
  memset(__s,0,uVar1);
  return;
}

Assistant:

explicit BloomFilter(const size_t n) : hasher() {
    this->size = 0;
    this->kk = getBestK(bits_per_item);
    this->bitCount = n * bits_per_item;
    this->arrayLength = (bitCount + 63) / 64;
    data = new uint64_t[arrayLength];
    std::fill_n(data, arrayLength, 0);
  }